

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_read.c
# Opt level: O1

int getlx(char **iline,FILE *fp)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  
  pcVar5 = *iline;
  *pcVar5 = '\0';
  pcVar1 = fgets(pcVar5,8,(FILE *)fp);
  pcVar2 = pcVar5;
  if (pcVar1 != (char *)0x0) {
    lVar7 = 8;
    sVar6 = 8;
    pcVar1 = pcVar5;
    do {
      pcVar2 = strchr(pcVar5,10);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
        pcVar2 = pcVar1;
        break;
      }
      sVar6 = sVar6 * 2;
      pcVar2 = (char *)realloc(pcVar1,sVar6);
      if (pcVar2 == (char *)0x0) {
        getlx_cold_1();
        return -1;
      }
      pcVar1 = pcVar5 + (lVar7 - (long)pcVar1);
      pcVar5 = pcVar2 + (long)(pcVar1 + -1);
      lVar7 = sVar6 - (long)pcVar1;
      pcVar3 = fgets(pcVar5,(int)lVar7,(FILE *)fp);
      pcVar1 = pcVar2;
    } while (pcVar3 != (char *)0x0);
  }
  piVar4 = __errno_location();
  if (*piVar4 == 0) {
    if (*pcVar2 != '\0') {
      pcVar5 = strchr(pcVar5,10);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
      sVar6 = strlen(pcVar2);
      return (int)sVar6;
    }
  }
  else {
    getlx_cold_2();
  }
  return -1;
}

Assistant:

int getlx(char **iline,FILE *fp)
	{
		char *line = *iline;
		char *newline = NULL;
		char *buf = NULL;
		char *eol = NULL;
		size_t capacity = sizeof(line); /* reasonable starting point for line length */
		size_t remaining = capacity;
		size_t used = 0;

		buf = line; /* point buf -> line */
		line[0] = '\0';

		/* read file  into buf */
		while (fgets(buf, remaining, fp)) {
			eol = strchr(buf, '\n'); /* locate first occurrence of '\n' */
			if (eol) { /* found a newline in the string */
				*eol = '\0'; /* replace the newline with the null character */
				break;
			} else {
				/* buffer was too small - enlarge it */
				used = buf + remaining - line;

				newline = realloc(line, capacity * 2);
				if (!newline) {
					fprintf(stderr, "getl - realloc: %s\n", strerror(errno));
					return -1;
				} else {
					line = newline;
				}

				buf = line + used - 1;
				capacity *= 2;
				remaining = capacity - used;
			}
		}

		if (errno) {
			fprintf(stderr, "getl - fgets: %s\n", strerror(errno));
		} else if (line[0]) {
			char *eol = strchr(buf, '\n');
			if (eol)
				*eol = '\0';
			/*buf = line;*/
			return strlen(line);
		}
		return -1;
	}